

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_id_func.h
# Opt level: O0

void __thiscall TinyIntIDFunc<1>::TinyIntIDFunc(TinyIntIDFunc<1> *this,int preimage)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  *in_RDI = in_ESI;
  ArrayIDFunc<unsigned_long>::ArrayIDFunc
            ((ArrayIDFunc<unsigned_long> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec);
  return;
}

Assistant:

explicit TinyIntIDFunc(int preimage)
        : preimage_(preimage)
        , data_((preimage + entry_count_per_uint64 - 1) / entry_count_per_uint64)
    {
    }